

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByPrintableName
          (DescriptorPool *this,Descriptor *extendee,string *printable_name)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Descriptor *pDVar4;
  FieldDescriptor *this_00;
  Descriptor *pDVar5;
  DescriptorPool *in_RDX;
  Descriptor *in_RSI;
  FieldDescriptor *extension;
  int i;
  int type_extension_count;
  Descriptor *type;
  FieldDescriptor *result;
  int local_38;
  string *in_stack_ffffffffffffffd0;
  DescriptorPool *in_stack_ffffffffffffffd8;
  string *local_8;
  
  iVar2 = Descriptor::extension_range_count(in_RSI);
  if (iVar2 == 0) {
    local_8 = (string *)0x0;
  }
  else {
    local_8 = (string *)FindExtensionByName(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if ((local_8 == (string *)0x0) ||
       (pDVar4 = FieldDescriptor::containing_type((FieldDescriptor *)local_8), pDVar4 != in_RSI)) {
      Descriptor::options(in_RSI);
      bVar1 = MessageOptions::message_set_wire_format((MessageOptions *)0x4910d6);
      if ((bVar1) && (pDVar4 = FindMessageTypeByName(in_RDX,local_8), pDVar4 != (Descriptor *)0x0))
      {
        iVar2 = Descriptor::extension_count(pDVar4);
        for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
          this_00 = Descriptor::extension(pDVar4,local_38);
          pDVar5 = FieldDescriptor::containing_type(this_00);
          if ((((pDVar5 == in_RSI) &&
               (TVar3 = FieldDescriptor::type((FieldDescriptor *)pDVar4), TVar3 == TYPE_MESSAGE)) &&
              (bVar1 = FieldDescriptor::is_optional((FieldDescriptor *)0x49115b), bVar1)) &&
             (pDVar5 = FieldDescriptor::message_type(this_00), pDVar5 == pDVar4)) {
            return this_00;
          }
        }
      }
      local_8 = (string *)0x0;
    }
  }
  return (FieldDescriptor *)local_8;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByPrintableName(
    const Descriptor* extendee, const std::string& printable_name) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  const FieldDescriptor* result = FindExtensionByName(printable_name);
  if (result != nullptr && result->containing_type() == extendee) {
    return result;
  }
  if (extendee->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = FindMessageTypeByName(printable_name);
    if (type != nullptr) {
      // Look for a matching extension in the foreign type's scope.
      const int type_extension_count = type->extension_count();
      for (int i = 0; i < type_extension_count; i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == extendee &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() && extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }
  return nullptr;
}